

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::SetDefaultFieldValuePrinter
          (Printer *this,FieldValuePrinter *printer)

{
  FastFieldValuePrinter *pFVar1;
  FastFieldValuePrinter *pFVar2;
  
  pFVar2 = (FastFieldValuePrinter *)operator_new(0x10);
  pFVar2->_vptr_FastFieldValuePrinter = (_func_int **)&PTR__FieldValuePrinterWrapper_00442ce8;
  pFVar2[1]._vptr_FastFieldValuePrinter = (_func_int **)printer;
  pFVar1 = (this->default_field_value_printer_)._M_t.
           super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
           .
           super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>
           ._M_head_impl;
  (this->default_field_value_printer_)._M_t.
  super___uniq_ptr_impl<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>
  .super__Head_base<0UL,_const_google::protobuf::TextFormat::FastFieldValuePrinter_*,_false>.
  _M_head_impl = pFVar2;
  if (pFVar1 != (FastFieldValuePrinter *)0x0) {
    (*pFVar1->_vptr_FastFieldValuePrinter[1])();
    return;
  }
  return;
}

Assistant:

void TextFormat::Printer::SetDefaultFieldValuePrinter(
    const FieldValuePrinter* printer) {
  default_field_value_printer_ =
      std::make_unique<FieldValuePrinterWrapper>(printer);
}